

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

ggml_opt_optimizer_params *
ggml_opt_get_default_optimizer_params
          (ggml_opt_optimizer_params *__return_storage_ptr__,void *userdata)

{
  void *userdata_local;
  
  (__return_storage_ptr__->adamw).alpha = 0.001;
  (__return_storage_ptr__->adamw).beta1 = 0.9;
  (__return_storage_ptr__->adamw).beta2 = 0.999;
  (__return_storage_ptr__->adamw).eps = 1e-08;
  (__return_storage_ptr__->adamw).wd = 0.0;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_opt_optimizer_params ggml_opt_get_default_optimizer_params(void * userdata) {
    GGML_UNUSED(userdata);

    ggml_opt_optimizer_params result;

    result.adamw.alpha = 0.001f;
    result.adamw.beta1 = 0.9f;
    result.adamw.beta2 = 0.999f;
    result.adamw.eps   = 1e-8f;
    result.adamw.wd    = 0.0f;

    return result;
}